

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Bool prvTidyFindNodeWithId(Node *node,TidyTagId tid)

{
  Bool BVar1;
  Node *node_00;
  
  while( true ) {
    if (node == (Node *)0x0) {
      return no;
    }
    node_00 = node;
    if ((node->tag != (Dict *)0x0) && (node->tag->id == tid)) break;
    while (node_00 = node_00->content, node_00 != (Node *)0x0) {
      BVar1 = prvTidyFindNodeWithId(node_00,tid);
      if (BVar1 != no) {
        return yes;
      }
    }
    node = node->next;
  }
  return yes;
}

Assistant:

Bool TY_(FindNodeWithId)( Node *node, TidyTagId tid )
{
    Node *content;
    while (node)
    {
        if (TagIsId(node,tid))
            return yes;
        for (content = node->content; content; content = content->content)
        {
            if (TY_(FindNodeWithId)(content,tid))
                return yes;
        }
        node = node->next;
    }
    return no;
}